

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

void __thiscall t_json_generator::write_comma_if_needed(t_json_generator *this)

{
  _Elt_pointer pbVar1;
  
  pbVar1 = (this->comma_needed_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 == (this->comma_needed_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pbVar1 = (this->comma_needed_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
  }
  if (pbVar1[-1] == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_json_,",",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->f_json_,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    return;
  }
  return;
}

Assistant:

void t_json_generator::write_comma_if_needed() {
  if (comma_needed_.top()) {
    f_json_ << "," << endl;
  }
}